

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CrossSite.cpp
# Opt level: O0

Var Js::CrossSite::CommonThunk
              (RecyclableObject *recyclableObject,JavascriptMethod entryPoint,Arguments *args)

{
  code *pcVar1;
  HostScriptContext *pHVar2;
  Arguments *entryPoint_00;
  bool bVar3;
  uint uVar4;
  BOOL BVar5;
  int iVar6;
  Attributes AVar7;
  undefined4 *puVar8;
  ThreadContext *pTVar9;
  ScriptContext *pSVar10;
  JavascriptFunction *pJVar11;
  FunctionInfo *pFVar12;
  Var pvVar13;
  FrameDisplay *display;
  JavascriptMethod thunk;
  FunctionInfo *local_178;
  anon_class_48_6_9e8417c9 local_168;
  anon_class_96_12_d6763c94 local_138;
  BOOL local_d8 [2];
  BOOL wasCallerSet;
  BOOL wasDispatchExCallerPushed;
  Var result;
  undefined8 uStack_c0;
  HRESULT hr;
  IUnknown *previousSourceCaller;
  IUnknown *sourceCaller;
  ScriptFunction *callFunc;
  CheckCodeGenFunction checkCodeGenFunction;
  uint local_98;
  uint count;
  uint i;
  undefined1 local_80 [8];
  AutoReentrancyHandler autoReentrancyHandler;
  HostScriptContext *callerHostScriptContext;
  HostScriptContext *calleeHostScriptContext;
  ScriptContext *local_50;
  ScriptContext *targetScriptContext;
  AutoDisableRedeferral autoDisableRedeferral;
  FunctionInfo *functionInfo;
  DynamicObject *function;
  Arguments *args_local;
  JavascriptMethod entryPoint_local;
  RecyclableObject *recyclableObject_local;
  
  function = (DynamicObject *)args;
  args_local = (Arguments *)entryPoint;
  entryPoint_local = (JavascriptMethod)recyclableObject;
  functionInfo = (FunctionInfo *)VarTo<Js::DynamicObject,Js::RecyclableObject>(recyclableObject);
  bVar3 = VarIs<Js::JavascriptFunction,Js::DynamicObject>((DynamicObject *)functionInfo);
  if (bVar3) {
    pJVar11 = VarTo<Js::JavascriptFunction,Js::DynamicObject>((DynamicObject *)functionInfo);
    local_178 = JavascriptFunction::GetFunctionInfo(pJVar11);
  }
  else {
    local_178 = (FunctionInfo *)0x0;
  }
  autoDisableRedeferral._8_8_ = local_178;
  AutoDisableRedeferral::AutoDisableRedeferral
            ((AutoDisableRedeferral *)&targetScriptContext,local_178);
  local_50 = RecyclableObject::GetScriptContext((RecyclableObject *)functionInfo);
  uVar4 = (*(local_50->super_ScriptContextInfo)._vptr_ScriptContextInfo[0x24])();
  if ((uVar4 & 1) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/CrossSite.cpp"
                                ,0x1d0,"(!targetScriptContext->IsClosed())",
                                "!targetScriptContext->IsClosed()");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 0;
  }
  BVar5 = RecyclableObject::IsExternal((RecyclableObject *)functionInfo);
  if ((BVar5 == 0) &&
     (iVar6 = (**(code **)(functionInfo->originalEntryPoint + 0x330))(), iVar6 == 0)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/CrossSite.cpp"
                                ,0x1d1,"(function->IsExternal() || function->IsCrossSiteObject())",
                                "function->IsExternal() || function->IsCrossSiteObject()");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 0;
  }
  pTVar9 = ScriptContext::GetThreadContext(local_50);
  bVar3 = ThreadContext::IsScriptActive(pTVar9);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/CrossSite.cpp"
                                ,0x1d2,"(targetScriptContext->GetThreadContext()->IsScriptActive())"
                                ,"targetScriptContext->GetThreadContext()->IsScriptActive()");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 0;
  }
  callerHostScriptContext = ScriptContext::GetHostScriptContext(local_50);
  pTVar9 = ScriptContext::GetThreadContext(local_50);
  autoReentrancyHandler._8_8_ = ThreadContext::GetPreviousHostScriptContext(pTVar9);
  if (((HostScriptContext *)autoReentrancyHandler._8_8_ == callerHostScriptContext) ||
     (((HostScriptContext *)autoReentrancyHandler._8_8_ == (HostScriptContext *)0x0 &&
      (iVar6 = (*callerHostScriptContext->_vptr_HostScriptContext[10])(), iVar6 == 0)))) {
    pTVar9 = ScriptContext::GetThreadContext(local_50);
    AutoReentrancyHandler::AutoReentrancyHandler((AutoReentrancyHandler *)local_80,pTVar9);
    entryPoint_00 = args_local;
    pFVar12 = functionInfo;
    Arguments::Arguments((Arguments *)&i,args);
    recyclableObject_local =
         (RecyclableObject *)
         JavascriptFunction::CallFunction<true>
                   ((RecyclableObject *)pFVar12,(JavascriptMethod)entryPoint_00,(Arguments *)&i,true
                   );
    count = 1;
    AutoReentrancyHandler::~AutoReentrancyHandler((AutoReentrancyHandler *)local_80);
    goto LAB_00a0d45d;
  }
  pHVar2 = callerHostScriptContext;
  pSVar10 = HostScriptContext::GetScriptContext((HostScriptContext *)autoReentrancyHandler._8_8_);
  (*pHVar2->_vptr_HostScriptContext[0x19])(pHVar2,pSVar10);
  local_98 = 0;
  if (*args->Values == (void *)0x0) {
    local_98 = 1;
    bVar3 = Arguments::IsNewCall(args);
    if (!bVar3) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/CrossSite.cpp"
                                  ,0x1ea,"(args.IsNewCall())","args.IsNewCall()");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 0;
    }
    bVar3 = VarIs<Js::JavascriptProxy,Js::DynamicObject>((DynamicObject *)functionInfo);
    if (!bVar3) {
      bVar3 = VarIs<Js::JavascriptFunction,Js::DynamicObject>((DynamicObject *)functionInfo);
      if (bVar3) {
        pJVar11 = VarTo<Js::JavascriptFunction,Js::DynamicObject>((DynamicObject *)functionInfo);
        pFVar12 = JavascriptFunction::GetFunctionInfo(pJVar11);
        AVar7 = FunctionInfo::GetAttributes(pFVar12);
        if ((AVar7 & SkipDefaultNewObject) != None) goto LAB_00a0d02d;
      }
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/CrossSite.cpp"
                                  ,0x1eb,
                                  "(VarIs<JavascriptProxy>(function) || (VarIs<JavascriptFunction>(function) && VarTo<JavascriptFunction>(function)->GetFunctionInfo()->GetAttributes() & FunctionInfo::SkipDefaultNewObject))"
                                  ,
                                  "VarIs<JavascriptProxy>(function) || (VarIs<JavascriptFunction>(function) && VarTo<JavascriptFunction>(function)->GetFunctionInfo()->GetAttributes() & FunctionInfo::SkipDefaultNewObject)"
                                 );
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 0;
    }
  }
LAB_00a0d02d:
  checkCodeGenFunction._4_4_ = SUB84(args->Info,0) & 0xffffff;
  for (; local_98 < checkCodeGenFunction._4_4_; local_98 = local_98 + 1) {
    pvVar13 = MarshalVar(local_50,args->Values[local_98],false);
    args->Values[local_98] = pvVar13;
  }
  bVar3 = Arguments::HasNewTarget(args);
  pSVar10 = local_50;
  if (bVar3) {
    pvVar13 = Arguments::GetNewTarget(args);
    pvVar13 = MarshalVar(pSVar10,pvVar13,false);
    args->Values[checkCodeGenFunction._4_4_] = pvVar13;
  }
  else {
    bVar3 = Arguments::HasExtraArg(args);
    pSVar10 = local_50;
    if (bVar3) {
      display = Arguments::GetFrameDisplay(args);
      pvVar13 = MarshalFrameDisplay(pSVar10,display);
      args->Values[checkCodeGenFunction._4_4_] = pvVar13;
    }
  }
  callFunc = (ScriptFunction *)GetCheckCodeGenFunction((JavascriptMethod)args_local);
  if (callFunc != (ScriptFunction *)0x0) {
    sourceCaller = (IUnknown *)
                   VarTo<Js::ScriptFunction,Js::DynamicObject>((DynamicObject *)functionInfo);
    args_local = (Arguments *)(*(code *)callFunc)(sourceCaller);
    thunk = RecyclableObject::GetEntryPoint((RecyclableObject *)functionInfo);
    bVar3 = IsThunk(thunk);
    if (!bVar3) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/CrossSite.cpp"
                                  ,0x204,"(CrossSite::IsThunk(function->GetEntryPoint()))",
                                  "CrossSite::IsThunk(function->GetEntryPoint())");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 0;
    }
  }
  previousSourceCaller = (IUnknown *)0x0;
  uStack_c0 = 0;
  result._4_4_ = 0;
  _wasCallerSet = (RecyclableObject *)0x0;
  local_d8[1] = 0;
  local_d8[0] = 0;
  local_138.hr = (HRESULT *)((long)&result + 4);
  local_168.callerHostScriptContext =
       (HostScriptContext **)&autoReentrancyHandler.m_savedReentrancySafeOrHandled;
  local_168.sourceCaller = &previousSourceCaller;
  local_168.calleeHostScriptContext = &callerHostScriptContext;
  local_168.previousSourceCaller = (IUnknown **)&stack0xffffffffffffff40;
  local_168.wasCallerSet = local_d8;
  local_138.targetScriptContext = &local_50;
  local_168.wasDispatchExCallerPushed = local_d8 + 1;
  local_138.result = (Var *)&wasCallerSet;
  local_138.function = (DynamicObject **)&functionInfo;
  local_138.entryPoint = (JavascriptMethod *)&args_local;
  local_138.callerHostScriptContext = local_168.callerHostScriptContext;
  local_138.sourceCaller = local_168.sourceCaller;
  local_138.calleeHostScriptContext = local_168.calleeHostScriptContext;
  local_138.previousSourceCaller = local_168.previousSourceCaller;
  local_138.wasCallerSet = local_168.wasCallerSet;
  local_138.wasDispatchExCallerPushed = local_168.wasDispatchExCallerPushed;
  local_138.args = args;
  TryFinally<Js::CrossSite::CommonThunk(Js::RecyclableObject*,void*(*)(Js::RecyclableObject*,Js::CallInfo,___),Js::Arguments)::__0,Js::CrossSite::CommonThunk(Js::RecyclableObject*,void*(*)(Js::RecyclableObject*,Js::CallInfo,___),Js::Arguments)::__1>
            (&local_138,&local_168);
  if (_wasCallerSet == (RecyclableObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/CrossSite.cpp"
                                ,0x24a,"(result != nullptr)","result != nullptr");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 0;
  }
  recyclableObject_local = _wasCallerSet;
  count = 1;
LAB_00a0d45d:
  AutoDisableRedeferral::~AutoDisableRedeferral((AutoDisableRedeferral *)&targetScriptContext);
  return recyclableObject_local;
}

Assistant:

Var CrossSite::CommonThunk(RecyclableObject* recyclableObject, JavascriptMethod entryPoint, Arguments args)
    {
        DynamicObject* function = VarTo<DynamicObject>(recyclableObject);

        FunctionInfo * functionInfo = (VarIs<JavascriptFunction>(function) ? VarTo<JavascriptFunction>(function)->GetFunctionInfo() : nullptr);
        AutoDisableRedeferral autoDisableRedeferral(functionInfo);

        ScriptContext* targetScriptContext = function->GetScriptContext();
        Assert(!targetScriptContext->IsClosed());
        Assert(function->IsExternal() || function->IsCrossSiteObject());
        Assert(targetScriptContext->GetThreadContext()->IsScriptActive());

        HostScriptContext* calleeHostScriptContext = targetScriptContext->GetHostScriptContext();
        HostScriptContext* callerHostScriptContext = targetScriptContext->GetThreadContext()->GetPreviousHostScriptContext();

        if (callerHostScriptContext == calleeHostScriptContext || (callerHostScriptContext == nullptr && !calleeHostScriptContext->HasCaller()))
        {
            BEGIN_SAFE_REENTRANT_CALL(targetScriptContext->GetThreadContext())
            {
                return JavascriptFunction::CallFunction<true>(function, entryPoint, args, true /*useLargeArgCount*/);
            }
            END_SAFE_REENTRANT_CALL
        }

#if DBG_DUMP || defined(PROFILE_EXEC) || defined(PROFILE_MEM)
        calleeHostScriptContext->EnsureParentInfo(callerHostScriptContext->GetScriptContext());
#endif

        TTD_XSITE_LOG(recyclableObject->GetScriptContext(), "CommonThunk -- Pass Through", recyclableObject);

        uint i = 0;
        if (args.Values[0] == nullptr)
        {
            i = 1;
            Assert(args.IsNewCall());
            Assert(VarIs<JavascriptProxy>(function) || (VarIs<JavascriptFunction>(function) && VarTo<JavascriptFunction>(function)->GetFunctionInfo()->GetAttributes() & FunctionInfo::SkipDefaultNewObject));
        }
        uint count = args.Info.Count;
        for (; i < count; i++)
        {
            args.Values[i] = CrossSite::MarshalVar(targetScriptContext, args.Values[i]);
        }
        if (args.HasNewTarget())
        {
            // Last value is new.target
            args.Values[count] = CrossSite::MarshalVar(targetScriptContext, args.GetNewTarget());
        }
        else if (args.HasExtraArg())
        {
            // The final eval arg is a frame display that needs to be marshaled specially.
            args.Values[count] = CrossSite::MarshalFrameDisplay(targetScriptContext, args.GetFrameDisplay());
        }


#if ENABLE_NATIVE_CODEGEN
        CheckCodeGenFunction checkCodeGenFunction = GetCheckCodeGenFunction(entryPoint);
        if (checkCodeGenFunction != nullptr)
        {
            ScriptFunction* callFunc = VarTo<ScriptFunction>(function);
            entryPoint = checkCodeGenFunction(callFunc);
            Assert(CrossSite::IsThunk(function->GetEntryPoint()));
        }
#endif

        // We need to setup the caller chain when we go across script site boundary. Property access
        // is OK, and we need to let host know who the caller is when a call is from another script site.
        // CrossSiteObject is the natural place but it is in the target site. We build up the site
        // chain through PushDispatchExCaller/PopDispatchExCaller, and we call SetCaller in the target site
        // to indicate who the caller is. We first need to get the site from the previously pushed site
        // and set that as the caller for current call, and push a new DispatchExCaller for future calls
        // off this site. GetDispatchExCaller and ReleaseDispatchExCaller is used to get the current caller.
        // currentDispatchExCaller is cached to avoid multiple allocations.
        IUnknown* sourceCaller = nullptr, *previousSourceCaller = nullptr;
        HRESULT hr = NOERROR;
        Var result = nullptr;
        BOOL wasDispatchExCallerPushed = FALSE, wasCallerSet = FALSE;

        TryFinally([&]()
        {
            hr = callerHostScriptContext->GetDispatchExCaller((void**)&sourceCaller);

            if (SUCCEEDED(hr))
            {
                hr = calleeHostScriptContext->SetCaller((IUnknown*)sourceCaller, (IUnknown**)&previousSourceCaller);
            }

            if (SUCCEEDED(hr))
            {
                wasCallerSet = TRUE;
                hr = calleeHostScriptContext->PushHostScriptContext();
            }
            if (FAILED(hr))
            {
                // CONSIDER: Should this be callerScriptContext if we failed?
                JavascriptError::MapAndThrowError(targetScriptContext, hr);
            }
            wasDispatchExCallerPushed = TRUE;

            BEGIN_SAFE_REENTRANT_CALL(targetScriptContext->GetThreadContext())
            {
                result = JavascriptFunction::CallFunction<true>(function, entryPoint, args, true /*useLargeArgCount*/);
            }
            END_SAFE_REENTRANT_CALL
            ScriptContext* callerScriptContext = callerHostScriptContext->GetScriptContext();
            result = CrossSite::MarshalVar(callerScriptContext, result);
        },
        [&](bool hasException)
        {
            if (sourceCaller != nullptr)
            {
                callerHostScriptContext->ReleaseDispatchExCaller(sourceCaller);
            }
            IUnknown* originalCaller = nullptr;
            if (wasDispatchExCallerPushed)
            {
                calleeHostScriptContext->PopHostScriptContext();
            }
            if (wasCallerSet)
            {
                calleeHostScriptContext->SetCaller(previousSourceCaller, &originalCaller);
                if (previousSourceCaller)
                {
                    previousSourceCaller->Release();
                }
                if (originalCaller)
                {
                    originalCaller->Release();
                }
            }
        });
        Assert(result != nullptr);
        return result;
    }